

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser.cxx
# Opt level: O3

void __thiscall Fl_Browser::lineposition(Fl_Browser *this,int line,Fl_Line_Position pos)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  FL_BLINE *pFVar5;
  bool bVar6;
  int H;
  int W;
  int Y;
  int X;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  uVar4 = 1;
  if (1 < line) {
    uVar4 = line;
  }
  if (this->lines <= (int)uVar4) {
    uVar4 = this->lines;
  }
  pFVar5 = this->first;
  bVar6 = pFVar5 != (FL_BLINE *)0x0;
  iVar3 = 0;
  if (1 < (int)uVar4 && bVar6) {
    iVar3 = 0;
    do {
      iVar2 = (*(this->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[0xe])
                        (this,pFVar5);
      iVar3 = iVar2 + iVar3;
      pFVar5 = pFVar5->next;
      bVar6 = pFVar5 != (FL_BLINE *)0x0;
      if (pFVar5 == (FL_BLINE *)0x0) break;
      bVar1 = 2 < uVar4;
      uVar4 = uVar4 - 1;
    } while (bVar1);
  }
  if ((bool)(bVar6 ^ 1U | pos != BOTTOM)) {
    Fl_Browser_::bbox(&this->super_Fl_Browser_,&local_34,&local_38,&local_3c,&local_40);
    if (pos == MIDDLE) {
      iVar3 = iVar3 - local_40 / 2;
      goto LAB_001a6958;
    }
    if (pos != BOTTOM) goto LAB_001a6958;
  }
  else {
    iVar2 = (*(this->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[0xe])
                      (this,pFVar5);
    iVar3 = iVar3 + iVar2;
    Fl_Browser_::bbox(&this->super_Fl_Browser_,&local_34,&local_38,&local_3c,&local_40);
  }
  iVar3 = iVar3 - local_40;
LAB_001a6958:
  iVar2 = (*(this->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[0x16])(this);
  if (iVar2 - local_40 < iVar3) {
    iVar3 = (*(this->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[0x16])(this);
    iVar3 = iVar3 - local_40;
  }
  Fl_Browser_::position(&this->super_Fl_Browser_,iVar3);
  return;
}

Assistant:

void Fl_Browser::lineposition(int line, Fl_Line_Position pos) {
  if (line<1) line = 1;
  if (line>lines) line = lines;
  int p = 0;

  FL_BLINE* l;
  for (l=first; l && line>1; l = l->next) {
    line--; p += item_height(l);
  }
  if (l && (pos == BOTTOM)) p += item_height (l);

  int final = p, X, Y, W, H;
  bbox(X, Y, W, H);

  switch(pos) {
    case TOP: break;
    case BOTTOM: final -= H; break;
    case MIDDLE: final -= H/2; break;
  }
  
  if (final > (full_height() - H)) final = full_height() -H;
  position(final);
}